

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * get_next_command_abi_cxx11_(void)

{
  undefined8 __s;
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t pos;
  undefined1 local_50 [8];
  string val;
  char *input_raw;
  allocator<char> local_12;
  undefined1 local_11;
  string *retval;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"quit",&local_12);
  std::allocator<char>::~allocator(&local_12);
  bVar1 = std::ios::eof();
  if (((bVar1 & 1) == 0) && (val.field_2._8_8_ = readline("eval> "), val.field_2._8_8_ != 0)) {
    add_history(val.field_2._8_8_);
    __s = val.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,(char *)__s,(allocator<char> *)((long)&pos + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,"\t \n",0);
    if (sVar3 != 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,0,
                 sVar3);
    }
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_50,"\t \n",0xffffffffffffffff);
    if (sVar3 != 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 sVar3 + 1,0xffffffffffffffff);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50)
    ;
    free((void *)val.field_2._8_8_);
    std::__cxx11::string::~string((string *)local_50);
  }
  bVar2 = std::operator==(in_RDI,"quit");
  if ((((bVar2) || (bVar2 = std::operator==(in_RDI,"exit"), bVar2)) ||
      (bVar2 = std::operator==(in_RDI,"help"), bVar2)) ||
     (bVar2 = std::operator==(in_RDI,"version"), bVar2)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_RDI,"(0)");
  }
  return in_RDI;
}

Assistant:

std::string get_next_command() {
  std::string retval("quit");
  if (!std::cin.eof()) {
    char *input_raw = readline("eval> ");
    if (input_raw != nullptr) {
      add_history(input_raw);

      std::string val(input_raw);
      size_t pos = val.find_first_not_of("\t \n");
      if (pos != std::string::npos) {
        val.erase(0, pos);
      }
      pos = val.find_last_not_of("\t \n");
      if (pos != std::string::npos) {
        val.erase(pos + 1, std::string::npos);
      }

      retval = val;

      ::free(input_raw);
    }
  }
  if (retval == "quit" || retval == "exit" || retval == "help" || retval == "version") {
    retval += "(0)";
  }
  return retval;
}